

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall
QTextDocumentPrivate::insert(QTextDocumentPrivate *this,int pos,int strPos,int strLength,int format)

{
  QTextBlockData *pQVar1;
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  QTextDocumentPrivate *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  QTextDocumentPrivate *unaff_retaddr;
  QTextBlockData *B;
  int b;
  QTextUndoCommand c;
  QFragmentMap<QTextBlockData> *in_stack_ffffffffffffffb0;
  QTextDocumentPrivate *this_00;
  undefined8 in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff0;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < in_ECX) {
    this_00 = in_RDI;
    insert_string(unaff_retaddr,(int)((ulong)lVar2 >> 0x20),(uint)lVar2,
                  (uint)((ulong)in_stack_fffffffffffffff0 >> 0x20),(int)in_stack_fffffffffffffff0,
                  (Operation)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
    if ((in_RDI->undoEnabled & 1U) != 0) {
      QFragmentMap<QTextBlockData>::findNode
                (in_stack_ffffffffffffffb0,(int)((ulong)in_RDI >> 0x20),(uint)in_RDI);
      pQVar1 = QFragmentMap<QTextBlockData>::fragment
                         (in_stack_ffffffffffffffb0,(uint)((ulong)in_RDI >> 0x20));
      appendUndoItem((QTextDocumentPrivate *)CONCAT44(in_ESI,in_EDX),
                     (QTextUndoCommand *)CONCAT44(in_ECX,in_R8D));
      *(uint *)&pQVar1->field_0x44 =
           *(uint *)&pQVar1->field_0x44 & 0x80000000 | in_RDI->revision & 0x7fffffffU;
    }
    finishEdit(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::insert(int pos, int strPos, int strLength, int format)
{
    if (strLength <= 0)
        return;

    Q_ASSERT(pos >= 0 && pos < fragments.length());
    Q_ASSERT(formats.format(format).isCharFormat());

    insert_string(pos, strPos, strLength, format, QTextUndoCommand::MoveCursor);
    if (undoEnabled) {
        int b = blocks.findNode(pos);
        QTextBlockData *B = blocks.fragment(b);

        QT_INIT_TEXTUNDOCOMMAND(c, QTextUndoCommand::Inserted, (editBlock != 0),
                                QTextUndoCommand::MoveCursor, format, strPos, pos, strLength,
                                B->revision);
        appendUndoItem(c);
        B->revision = revision;
        Q_ASSERT(undoState == undoStack.size());
    }
    finishEdit();
}